

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_bbdpre.c
# Opt level: O3

int KINBBDPrecGetWorkSpace(void *kinmem,long *lenrwBBDP,long *leniwBBDP)

{
  long lVar1;
  int line;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "KINSOL Memory is NULL.";
    iVar2 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0x133;
  }
  else if (*(long *)((long)kinmem + 0x248) == 0) {
    msgfmt = "Linear solver memory is NULL. One of the SPILS linear solvers must be attached.";
    iVar2 = -2;
    error_code = -2;
    line = 0x13b;
  }
  else {
    lVar1 = *(long *)(*(long *)((long)kinmem + 0x248) + 0x90);
    if (lVar1 != 0) {
      *lenrwBBDP = *(long *)(lVar1 + 0x78);
      *leniwBBDP = *(long *)(lVar1 + 0x80);
      return 0;
    }
    msgfmt = "BBD peconditioner memory is NULL. IDABBDPrecInit must be called.";
    iVar2 = -5;
    error_code = -5;
    line = 0x143;
  }
  KINProcessError((KINMem)kinmem,error_code,line,"KINBBDPrecGetWorkSpace",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_bbdpre.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int KINBBDPrecGetWorkSpace(void* kinmem, long int* lenrwBBDP, long int* leniwBBDP)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  KBBDPrecData pdata;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KINLS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_NULL);
    return (KINLS_MEM_NULL);
  }
  kin_mem = (KINMem)kinmem;

  if (kin_mem->kin_lmem == NULL)
  {
    KINProcessError(kin_mem, KINLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_LMEM_NULL);
    return (KINLS_LMEM_NULL);
  }
  kinls_mem = (KINLsMem)kin_mem->kin_lmem;

  if (kinls_mem->pdata == NULL)
  {
    KINProcessError(kin_mem, KINLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_PMEM_NULL);
    return (KINLS_PMEM_NULL);
  }
  pdata = (KBBDPrecData)kinls_mem->pdata;

  *lenrwBBDP = pdata->rpwsize;
  *leniwBBDP = pdata->ipwsize;

  return (KINLS_SUCCESS);
}